

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxharrisrt.hpp
# Opt level: O0

SPxId __thiscall
soplex::SPxHarrisRT<double>::selectEnter
          (SPxHarrisRT<double> *this,double *val,int param_3,bool param_4)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  element_type *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  UpdateVector<double> *pUVar5;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  double *pdVar6;
  SPxSolverBase<double> *pSVar7;
  double *pdVar8;
  double *pdVar9;
  char *pcVar10;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  double *pdVar11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  byte in_CL;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 uVar12;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 extraout_RDX_10;
  undefined8 extraout_RDX_11;
  undefined8 extraout_RDX_12;
  undefined8 extraout_RDX_13;
  undefined8 extraout_RDX_14;
  undefined8 extraout_RDX_15;
  undefined8 extraout_RDX_16;
  undefined8 extraout_RDX_17;
  undefined8 extraout_RDX_18;
  undefined8 extraout_RDX_19;
  undefined8 extraout_RDX_20;
  undefined8 extraout_RDX_21;
  undefined8 extraout_RDX_22;
  undefined8 extraout_RDX_23;
  undefined8 extraout_RDX_24;
  undefined8 extraout_RDX_25;
  undefined8 extraout_RDX_26;
  undefined8 extraout_RDX_27;
  undefined8 extraout_RDX_28;
  undefined8 extraout_RDX_29;
  undefined8 extraout_RDX_30;
  double *in_RSI;
  SPxHarrisRT<double> *in_RDI;
  Real RVar13;
  double dVar14;
  double dVar15;
  VectorBase<double> *lcb;
  VectorBase<double> *ucb;
  VectorBase<double> *lpb;
  VectorBase<double> *upb;
  SSVectorBase<double> *cupd;
  VectorBase<double> *cvec;
  SSVectorBase<double> *pupd;
  VectorBase<double> *pvec;
  double degeneps;
  double epsilon;
  double minStability;
  int cnr;
  int pnr;
  double rmaxabs;
  double cmaxabs;
  double ruseeps;
  double cuseeps;
  double lastshift;
  double sel;
  double max;
  double y;
  double x;
  double stab;
  int j;
  int i;
  SPxId enterId;
  SPxRatioTester<double> *in_stack_fffffffffffffcb8;
  SSVectorBase<double> *in_stack_fffffffffffffcd0;
  undefined4 in_stack_fffffffffffffcd8;
  int in_stack_fffffffffffffcdc;
  SPxSolverBase<double> *in_stack_fffffffffffffce0;
  VectorBase<double> *in_stack_fffffffffffffce8;
  undefined4 in_stack_fffffffffffffcf0;
  int in_stack_fffffffffffffcf4;
  double *in_stack_fffffffffffffd38;
  int *in_stack_fffffffffffffd40;
  int in_stack_fffffffffffffd4c;
  double *in_stack_fffffffffffffd50;
  double *in_stack_fffffffffffffd58;
  undefined4 in_stack_fffffffffffffd60;
  int in_stack_fffffffffffffd64;
  undefined4 in_stack_fffffffffffffd70;
  undefined4 in_stack_fffffffffffffd74;
  double *in_stack_fffffffffffffd78;
  double *in_stack_fffffffffffffd80;
  double local_130;
  DataKey local_128;
  DataKey local_120;
  double local_118;
  DataKey local_110;
  DataKey local_108;
  double local_100;
  DataKey local_f8;
  DataKey local_f0;
  VectorBase<double> *local_e8;
  VectorBase<double> *local_e0;
  VectorBase<double> *local_d8;
  VectorBase<double> *local_d0;
  SSVectorBase<double> *local_c8;
  UpdateVector<double> *local_c0;
  SSVectorBase<double> *local_b8;
  UpdateVector<double> *local_b0;
  double local_a8;
  double local_a0;
  Real local_88;
  uint local_80;
  int local_7c;
  double local_78;
  double local_70;
  double local_68;
  double local_60;
  double local_58;
  double local_50;
  double local_48;
  double local_40;
  double local_38;
  double local_30;
  uint local_28;
  int local_24;
  byte local_1d;
  double *local_18;
  DataKey local_8;
  
  local_1d = in_CL & 1;
  local_18 = in_RSI;
  SPxId::SPxId((SPxId *)0x2edfe6);
  local_48 = 0.0;
  local_50 = 0.0;
  local_70 = 1.0;
  local_78 = 1.0;
  SPxRatioTester<double>::tolerances(in_stack_fffffffffffffcb8);
  this_00 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x2ee042);
  RVar13 = Tolerances::scaleAccordingToEpsilon(this_00,0.0001);
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x2ee068);
  local_88 = RVar13;
  (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_a0 = SPxSolverBase<double>::epsilon((SPxSolverBase<double> *)0x2ee090);
  local_a8 = degenerateEps((SPxHarrisRT<double> *)in_stack_fffffffffffffcd0);
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_b0 = SPxSolverBase<double>::pVec((SPxSolverBase<double> *)CONCAT44(extraout_var,iVar2));
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  pUVar5 = SPxSolverBase<double>::pVec((SPxSolverBase<double> *)CONCAT44(extraout_var_00,iVar2));
  local_b8 = UpdateVector<double>::delta(pUVar5);
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_c0 = SPxSolverBase<double>::coPvec((SPxSolverBase<double> *)CONCAT44(extraout_var_01,iVar2))
  ;
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  pUVar5 = SPxSolverBase<double>::coPvec((SPxSolverBase<double> *)CONCAT44(extraout_var_02,iVar2));
  local_c8 = UpdateVector<double>::delta(pUVar5);
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_d0 = SPxSolverBase<double>::upBound
                       ((SPxSolverBase<double> *)CONCAT44(extraout_var_03,iVar2));
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_d8 = SPxSolverBase<double>::lpBound
                       ((SPxSolverBase<double> *)CONCAT44(extraout_var_04,iVar2));
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_e0 = SPxSolverBase<double>::ucBound
                       ((SPxSolverBase<double> *)CONCAT44(extraout_var_05,iVar2));
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  local_e8 = SPxSolverBase<double>::lcBound
                       ((SPxSolverBase<double> *)CONCAT44(extraout_var_06,iVar2));
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  pUVar5 = SPxSolverBase<double>::coPvec((SPxSolverBase<double> *)CONCAT44(extraout_var_07,iVar2));
  UpdateVector<double>::delta(pUVar5);
  SSVectorBase<double>::setup(in_stack_fffffffffffffcd0);
  iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
  pUVar5 = SPxSolverBase<double>::pVec((SPxSolverBase<double> *)CONCAT44(extraout_var_08,iVar2));
  UpdateVector<double>::delta(pUVar5);
  SSVectorBase<double>::setup(in_stack_fffffffffffffcd0);
  if (*local_18 <= local_a0) {
    if (*local_18 < -local_a0) {
LAB_002ef199:
      do {
        while( true ) {
          while( true ) {
            do {
              local_7c = -1;
              local_80 = 0xffffffff;
              local_48 = *local_18;
              iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
              local_58 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_11,iVar2) + 0x368))();
              iVar2 = SSVectorBase<double>::size((SSVectorBase<double> *)0x2ef1f4);
              pdVar6 = (double *)SSVectorBase<double>::indexMem(local_b8);
              pdVar8 = SSVectorBase<double>::values((SSVectorBase<double> *)0x2ef21d);
              VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ef232);
              VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ef247);
              VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ef25c);
              minDelta((SPxHarrisRT<double> *)
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                       in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c
                       ,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                       (double *)CONCAT44(iVar2,in_stack_fffffffffffffd70),pdVar6,pdVar8);
              SSVectorBase<double>::size((SSVectorBase<double> *)0x2ef2bb);
              SSVectorBase<double>::indexMem(local_c8);
              SSVectorBase<double>::values((SSVectorBase<double> *)0x2ef2e4);
              pdVar9 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ef2f9);
              pSVar7 = (SPxSolverBase<double> *)
                       VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ef30e);
              pdVar11 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ef323);
              minDelta((SPxHarrisRT<double> *)
                       CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                       in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c
                       ,in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                       (double *)CONCAT44(iVar2,in_stack_fffffffffffffd70),pdVar6,pdVar8);
              if ((local_48 == *local_18) && (!NAN(local_48) && !NAN(*local_18))) {
                return (SPxId)local_8;
              }
              local_30 = 0.0;
              pdVar6 = (double *)infinity();
              local_50 = *pdVar6;
              local_68 = local_78 * local_a0 * 0.001;
              local_60 = local_70 * local_a0 * 0.001;
              local_28 = SSVectorBase<double>::size((SSVectorBase<double> *)0x2ef40c);
              uVar12 = extraout_RDX_15;
              while (local_28 = local_28 - 1, -1 < (int)local_28) {
                pcVar10 = SSVectorBase<double>::index(local_b8,(char *)(ulong)local_28,(int)uVar12);
                local_24 = (int)pcVar10;
                local_38 = SSVectorBase<double>::operator[]
                                     ((SSVectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                iVar2 = (int)((ulong)pdVar9 >> 0x20);
                if (local_38 <= local_68) {
                  if (-local_68 <= local_38) {
                    local_130 = SSVectorBase<double>::operator[]
                                          ((SSVectorBase<double> *)pSVar7,iVar2);
                    SPxOut::debug<soplex::SPxHarrisRT<double>,_const_char_(&)[28],_double,_0>
                              (in_RDI,(char (*) [28])"DHARRI03 removing value {}\n",&local_130);
                    SSVectorBase<double>::clearNum
                              (in_stack_fffffffffffffcd0,(int)((ulong)pdVar11 >> 0x20));
                    uVar12 = extraout_RDX_22;
                  }
                  else {
                    in_stack_fffffffffffffd50 =
                         VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
                    in_stack_fffffffffffffd50 = (double *)*in_stack_fffffffffffffd50;
                    pdVar6 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                    local_40 = (double)in_stack_fffffffffffffd50 - *pdVar6;
                    if (-local_a8 <= local_40) {
                      local_40 = local_40 / local_38;
                      uVar12 = extraout_RDX_19;
                      if ((local_48 <= local_40) && (local_30 < -local_38)) {
                        (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                        local_128 = (DataKey)SPxSolverBase<double>::id
                                                       ((SPxSolverBase<double> *)
                                                        CONCAT44(in_stack_fffffffffffffcdc,
                                                                 in_stack_fffffffffffffcd8),
                                                        (int)((ulong)in_stack_fffffffffffffcd0 >>
                                                             0x20));
                        local_50 = local_40;
                        local_7c = local_24;
                        local_30 = -local_38;
                        uVar12 = extraout_RDX_21;
                        local_8 = local_128;
                      }
                    }
                    else {
                      iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                      in_stack_fffffffffffffd40 = (int *)CONCAT44(extraout_var_13,iVar2);
                      in_stack_fffffffffffffd4c = local_24;
                      VectorBase<double>::operator[]
                                ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                      SPxSolverBase<double>::shiftUPbound
                                ((SPxSolverBase<double> *)
                                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                 (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                                 (double)in_stack_fffffffffffffce0);
                      uVar12 = extraout_RDX_20;
                    }
                  }
                }
                else {
                  pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
                  dVar15 = *pdVar6;
                  pdVar6 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                  local_40 = dVar15 - *pdVar6;
                  if (local_40 <= local_a8) {
                    local_40 = local_40 / local_38;
                    uVar12 = extraout_RDX_16;
                    if ((local_48 <= local_40) && (local_30 < local_38)) {
                      (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                      local_120 = (DataKey)SPxSolverBase<double>::id
                                                     ((SPxSolverBase<double> *)
                                                      CONCAT44(in_stack_fffffffffffffcdc,
                                                               in_stack_fffffffffffffcd8),
                                                      (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20
                                                           ));
                      local_50 = local_40;
                      local_7c = local_24;
                      local_30 = local_38;
                      uVar12 = extraout_RDX_18;
                      local_8 = local_120;
                    }
                  }
                  else {
                    iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                    in_stack_fffffffffffffd58 = (double *)CONCAT44(extraout_var_12,iVar2);
                    in_stack_fffffffffffffd64 = local_24;
                    VectorBase<double>::operator[]
                              ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                    SPxSolverBase<double>::shiftLPbound
                              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                               (double)in_stack_fffffffffffffcd0);
                    uVar12 = extraout_RDX_17;
                  }
                }
              }
              local_28 = SSVectorBase<double>::size((SSVectorBase<double> *)0x2ef837);
              uVar12 = extraout_RDX_23;
              while( true ) {
                dVar15 = local_58;
                iVar2 = (int)((ulong)pdVar9 >> 0x20);
                iVar4 = (int)((ulong)pdVar11 >> 0x20);
                local_28 = local_28 - 1;
                if ((int)local_28 < 0) break;
                pcVar10 = SSVectorBase<double>::index(local_c8,(char *)(ulong)local_28,(int)uVar12);
                local_24 = (int)pcVar10;
                local_38 = SSVectorBase<double>::operator[]
                                     ((SSVectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                iVar2 = (int)((ulong)pdVar9 >> 0x20);
                if (local_38 <= local_60) {
                  if (-local_60 <= local_38) {
                    SPxOut::debug<soplex::SPxHarrisRT<double>,_const_char_(&)[28],_double_&,_0>
                              (in_RDI,(char (*) [28])"DHARRI04 removing value {}\n",&local_38);
                    SSVectorBase<double>::clearNum
                              (in_stack_fffffffffffffcd0,(int)((ulong)pdVar11 >> 0x20));
                    uVar12 = extraout_RDX_30;
                  }
                  else {
                    pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
                    dVar15 = *pdVar6;
                    pdVar6 = VectorBase<double>::operator[]
                                       ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                    local_40 = dVar15 - *pdVar6;
                    if (-local_a8 <= local_40) {
                      local_40 = local_40 / local_38;
                      uVar12 = extraout_RDX_27;
                      if ((local_48 <= local_40) && (local_30 < -local_38)) {
                        (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                        local_8 = (DataKey)SPxSolverBase<double>::coId
                                                     ((SPxSolverBase<double> *)
                                                      CONCAT44(in_stack_fffffffffffffcdc,
                                                               in_stack_fffffffffffffcd8),
                                                      (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20
                                                           ));
                        local_50 = local_40;
                        local_80 = local_28;
                        local_30 = -local_38;
                        uVar12 = extraout_RDX_29;
                      }
                    }
                    else {
                      (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                      VectorBase<double>::operator[]
                                ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                      SPxSolverBase<double>::shiftUCbound
                                ((SPxSolverBase<double> *)
                                 CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                                 (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                                 (double)in_stack_fffffffffffffce0);
                      uVar12 = extraout_RDX_28;
                    }
                  }
                }
                else {
                  in_stack_fffffffffffffd38 =
                       VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
                  in_stack_fffffffffffffd38 = (double *)*in_stack_fffffffffffffd38;
                  pdVar6 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                  local_40 = (double)in_stack_fffffffffffffd38 - *pdVar6;
                  if (local_40 <= local_a8) {
                    local_40 = local_40 / local_38;
                    uVar12 = extraout_RDX_24;
                    if ((local_48 <= local_40) && (local_30 < local_38)) {
                      (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                      local_8 = (DataKey)SPxSolverBase<double>::coId
                                                   ((SPxSolverBase<double> *)
                                                    CONCAT44(in_stack_fffffffffffffcdc,
                                                             in_stack_fffffffffffffcd8),
                                                    (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20))
                      ;
                      local_50 = local_40;
                      local_80 = local_28;
                      local_30 = local_38;
                      uVar12 = extraout_RDX_26;
                    }
                  }
                  else {
                    (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                    VectorBase<double>::operator[]
                              ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar9 >> 0x20));
                    SPxSolverBase<double>::shiftLCbound
                              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                               (double)in_stack_fffffffffffffcd0);
                    uVar12 = extraout_RDX_25;
                  }
                }
              }
              iVar3 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
              dVar14 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_14,iVar3) + 0x368))();
            } while ((dVar15 != dVar14) || (NAN(dVar15) || NAN(dVar14)));
            if ((int)local_80 < 0) break;
            (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            bVar1 = SPxSolverBase<double>::isBasic
                              (in_stack_fffffffffffffce0,
                               (SPxId *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8
                                                ));
            if (!bVar1) goto LAB_002effe0;
            SSVectorBase<double>::clearNum(in_stack_fffffffffffffcd0,iVar4);
          }
          if (local_7c < 0) {
            *local_18 = 0.0;
            SPxId::inValidate((SPxId *)&local_8);
            return (SPxId)local_8;
          }
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          SPxSolverBase<double>::vector(pSVar7,iVar2);
          dVar15 = SVectorBase<double>::operator*
                             ((SVectorBase<double> *)
                              CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                              in_stack_fffffffffffffce8);
          pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
          *pdVar6 = dVar15;
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          bVar1 = SPxSolverBase<double>::isBasic
                            (in_stack_fffffffffffffce0,
                             (SPxId *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8))
          ;
          if (!bVar1) break;
          SSVectorBase<double>::setValue
                    ((SSVectorBase<double> *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                     (double)in_stack_fffffffffffffcd0);
        }
        local_38 = SSVectorBase<double>::operator[]((SSVectorBase<double> *)pSVar7,iVar2);
        if (local_38 <= 0.0) {
          pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
          in_stack_fffffffffffffce0 = (SPxSolverBase<double> *)*pdVar6;
          pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
          local_50 = (double)in_stack_fffffffffffffce0 - *pdVar6;
          if ((-local_38 < local_88) && (local_50 < (in_RDI->super_SPxRatioTester<double>).delta)) {
            local_88 = local_88 / 2.0;
            iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            in_stack_fffffffffffffcd0 = (SSVectorBase<double> *)CONCAT44(extraout_var_16,iVar4);
            in_stack_fffffffffffffcdc = local_7c;
            VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
            SPxSolverBase<double>::shiftUPbound
                      ((SPxSolverBase<double> *)
                       CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                       (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                       (double)in_stack_fffffffffffffce0);
            goto LAB_002ef199;
          }
        }
        else {
          pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
          dVar15 = *pdVar6;
          pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
          local_50 = dVar15 - *pdVar6;
          if ((local_38 < local_88) && (-local_50 < (in_RDI->super_SPxRatioTester<double>).delta)) {
            local_88 = local_88 / 2.0;
            iVar4 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            in_stack_fffffffffffffce8 = (VectorBase<double> *)CONCAT44(extraout_var_15,iVar4);
            in_stack_fffffffffffffcf4 = local_7c;
            VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
            SPxSolverBase<double>::shiftLPbound
                      (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                       (double)in_stack_fffffffffffffcd0);
            goto LAB_002ef199;
          }
        }
        local_50 = local_50 / local_38;
      } while (local_50 < local_48);
    }
  }
  else {
LAB_002ee218:
    do {
      while( true ) {
        while( true ) {
          do {
            local_7c = -1;
            local_80 = 0xffffffff;
            local_48 = *local_18;
            iVar2 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            local_58 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_09,iVar2) + 0x368))();
            SSVectorBase<double>::size((SSVectorBase<double> *)0x2ee273);
            SSVectorBase<double>::indexMem(local_b8);
            SSVectorBase<double>::values((SSVectorBase<double> *)0x2ee29c);
            VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ee2b1);
            VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ee2c6);
            VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ee2db);
            maxDelta((SPxHarrisRT<double> *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                     in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (double *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
            SSVectorBase<double>::size((SSVectorBase<double> *)0x2ee33a);
            SSVectorBase<double>::indexMem(local_c8);
            SSVectorBase<double>::values((SSVectorBase<double> *)0x2ee363);
            pdVar6 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ee378);
            pSVar7 = (SPxSolverBase<double> *)
                     VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ee38d);
            pdVar8 = VectorBase<double>::get_const_ptr((VectorBase<double> *)0x2ee3a2);
            maxDelta((SPxHarrisRT<double> *)
                     CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60),
                     in_stack_fffffffffffffd58,in_stack_fffffffffffffd50,in_stack_fffffffffffffd4c,
                     in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (double *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),
                     in_stack_fffffffffffffd78,in_stack_fffffffffffffd80);
            if ((local_48 == *local_18) && (!NAN(local_48) && !NAN(*local_18))) {
              return (SPxId)local_8;
            }
            local_30 = 0.0;
            pdVar9 = (double *)infinity();
            local_50 = -*pdVar9;
            local_68 = local_78 * 0.001 * local_a0;
            if (local_68 < local_a0) {
              local_68 = local_a0;
            }
            local_60 = local_70 * 0.001 * local_a0;
            if (local_60 < local_a0) {
              local_60 = local_a0;
            }
            local_28 = SSVectorBase<double>::size((SSVectorBase<double> *)0x2ee4ee);
            uVar12 = extraout_RDX;
            while (local_28 = local_28 - 1, -1 < (int)local_28) {
              pcVar10 = SSVectorBase<double>::index(local_b8,(char *)(ulong)local_28,(int)uVar12);
              local_24 = (int)pcVar10;
              local_38 = SSVectorBase<double>::operator[]
                                   ((SSVectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
              iVar2 = (int)((ulong)pdVar6 >> 0x20);
              if (local_38 <= local_68) {
                if (-local_68 <= local_38) {
                  local_100 = SSVectorBase<double>::operator[]((SSVectorBase<double> *)pSVar7,iVar2)
                  ;
                  SPxOut::debug<soplex::SPxHarrisRT<double>,_const_char_(&)[28],_double,_0>
                            (in_RDI,(char (*) [28])"DHARRI01 removing value {}\n",&local_100);
                  SSVectorBase<double>::clearNum
                            (in_stack_fffffffffffffcd0,(int)((ulong)pdVar8 >> 0x20));
                  uVar12 = extraout_RDX_06;
                }
                else {
                  pdVar9 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
                  dVar15 = *pdVar9;
                  pdVar9 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
                  local_40 = dVar15 - *pdVar9;
                  if (local_40 <= local_a8) {
                    local_40 = local_40 / local_38;
                    uVar12 = extraout_RDX_03;
                    if ((local_40 <= local_48) && (local_30 <= -local_38)) {
                      (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                      local_f8 = (DataKey)SPxSolverBase<double>::id
                                                    ((SPxSolverBase<double> *)
                                                     CONCAT44(in_stack_fffffffffffffcdc,
                                                              in_stack_fffffffffffffcd8),
                                                     (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20)
                                                    );
                      local_50 = local_40;
                      local_7c = local_24;
                      local_30 = -local_38;
                      uVar12 = extraout_RDX_05;
                      local_8 = local_f8;
                    }
                  }
                  else {
                    (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                    VectorBase<double>::operator[]
                              ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
                    SPxSolverBase<double>::shiftLPbound
                              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                               (double)in_stack_fffffffffffffcd0);
                    uVar12 = extraout_RDX_04;
                  }
                }
              }
              else {
                pdVar9 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
                dVar15 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
                local_40 = dVar15 - *pdVar9;
                if (-local_a8 <= local_40) {
                  local_40 = local_40 / local_38;
                  uVar12 = extraout_RDX_00;
                  if ((local_40 <= local_48) && (local_30 <= local_38)) {
                    (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                    local_f0 = (DataKey)SPxSolverBase<double>::id
                                                  ((SPxSolverBase<double> *)
                                                   CONCAT44(in_stack_fffffffffffffcdc,
                                                            in_stack_fffffffffffffcd8),
                                                   (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20));
                    local_50 = local_40;
                    local_7c = local_24;
                    local_30 = local_38;
                    uVar12 = extraout_RDX_02;
                    local_8 = local_f0;
                  }
                }
                else {
                  (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                  VectorBase<double>::operator[]
                            ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
                  SPxSolverBase<double>::shiftUPbound
                            ((SPxSolverBase<double> *)
                             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                             (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             (double)in_stack_fffffffffffffce0);
                  uVar12 = extraout_RDX_01;
                }
              }
            }
            local_28 = SSVectorBase<double>::size((SSVectorBase<double> *)0x2ee933);
            uVar12 = extraout_RDX_07;
            while( true ) {
              dVar15 = local_58;
              iVar2 = (int)((ulong)pdVar6 >> 0x20);
              iVar4 = (int)((ulong)pdVar8 >> 0x20);
              local_28 = local_28 - 1;
              if ((int)local_28 < 0) break;
              pcVar10 = SSVectorBase<double>::index(local_c8,(char *)(ulong)local_28,(int)uVar12);
              local_24 = (int)pcVar10;
              local_38 = SSVectorBase<double>::operator[]
                                   ((SSVectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
              iVar2 = (int)((ulong)pdVar6 >> 0x20);
              if (local_38 <= local_60) {
                if (-local_60 <= local_38) {
                  local_118 = SSVectorBase<double>::operator[]((SSVectorBase<double> *)pSVar7,iVar2)
                  ;
                  SPxOut::debug<soplex::SPxHarrisRT<double>,_const_char_(&)[28],_double,_0>
                            (in_RDI,(char (*) [28])"DHARRI02 removing value {}\n",&local_118);
                  SSVectorBase<double>::clearNum
                            (in_stack_fffffffffffffcd0,(int)((ulong)pdVar8 >> 0x20));
                  uVar12 = extraout_RDX_14;
                }
                else {
                  pdVar9 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
                  dVar15 = *pdVar9;
                  pdVar9 = VectorBase<double>::operator[]
                                     ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
                  local_40 = dVar15 - *pdVar9;
                  if (local_40 <= local_a8) {
                    local_40 = local_40 / local_38;
                    uVar12 = extraout_RDX_11;
                    if ((local_40 <= local_48) && (local_30 <= -local_38)) {
                      (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                      local_110 = (DataKey)SPxSolverBase<double>::coId
                                                     ((SPxSolverBase<double> *)
                                                      CONCAT44(in_stack_fffffffffffffcdc,
                                                               in_stack_fffffffffffffcd8),
                                                      (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20
                                                           ));
                      local_50 = local_40;
                      local_80 = local_28;
                      local_30 = -local_38;
                      uVar12 = extraout_RDX_13;
                      local_8 = local_110;
                    }
                  }
                  else {
                    (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                    VectorBase<double>::operator[]
                              ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
                    SPxSolverBase<double>::shiftLCbound
                              (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                               (double)in_stack_fffffffffffffcd0);
                    uVar12 = extraout_RDX_12;
                  }
                }
              }
              else {
                pdVar9 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
                dVar15 = *pdVar9;
                pdVar9 = VectorBase<double>::operator[]
                                   ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
                local_40 = dVar15 - *pdVar9;
                if (-local_a8 <= local_40) {
                  local_40 = local_40 / local_38;
                  uVar12 = extraout_RDX_08;
                  if ((local_40 <= local_48) && (local_30 <= local_38)) {
                    (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                    local_108 = (DataKey)SPxSolverBase<double>::coId
                                                   ((SPxSolverBase<double> *)
                                                    CONCAT44(in_stack_fffffffffffffcdc,
                                                             in_stack_fffffffffffffcd8),
                                                    (int)((ulong)in_stack_fffffffffffffcd0 >> 0x20))
                    ;
                    local_50 = local_40;
                    local_80 = local_28;
                    local_30 = local_38;
                    uVar12 = extraout_RDX_10;
                    local_8 = local_108;
                  }
                }
                else {
                  (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
                  VectorBase<double>::operator[]
                            ((VectorBase<double> *)pSVar7,(int)((ulong)pdVar6 >> 0x20));
                  SPxSolverBase<double>::shiftUCbound
                            ((SPxSolverBase<double> *)
                             CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                             (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                             (double)in_stack_fffffffffffffce0);
                  uVar12 = extraout_RDX_09;
                }
              }
            }
            iVar3 = (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
            dVar14 = (double)(**(code **)(*(long *)CONCAT44(extraout_var_10,iVar3) + 0x368))();
          } while ((dVar15 != dVar14) || (NAN(dVar15) || NAN(dVar14)));
          if ((int)local_80 < 0) break;
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          bVar1 = SPxSolverBase<double>::isBasic
                            (in_stack_fffffffffffffce0,
                             (SPxId *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8))
          ;
          if (!bVar1) goto LAB_002effe0;
          SSVectorBase<double>::clearNum(in_stack_fffffffffffffcd0,iVar4);
        }
        if (local_7c < 0) {
          *local_18 = 0.0;
          SPxId::inValidate((SPxId *)&local_8);
          return (SPxId)local_8;
        }
        (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        SPxSolverBase<double>::vector(pSVar7,iVar2);
        dVar15 = SVectorBase<double>::operator*
                           ((SVectorBase<double> *)
                            CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                            in_stack_fffffffffffffce8);
        pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
        *pdVar6 = dVar15;
        (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
        bVar1 = SPxSolverBase<double>::isBasic
                          (in_stack_fffffffffffffce0,
                           (SPxId *)CONCAT44(in_stack_fffffffffffffcdc,in_stack_fffffffffffffcd8));
        if (!bVar1) break;
        SSVectorBase<double>::setValue
                  ((SSVectorBase<double> *)in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                   (double)in_stack_fffffffffffffcd0);
      }
      local_38 = SSVectorBase<double>::operator[]((SSVectorBase<double> *)pSVar7,iVar2);
      if (local_38 <= 0.0) {
        pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
        dVar15 = *pdVar6;
        pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
        local_50 = dVar15 - *pdVar6;
        if ((-local_38 < local_88) && (-local_50 < (in_RDI->super_SPxRatioTester<double>).delta)) {
          local_88 = local_88 / 2.0;
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
          SPxSolverBase<double>::shiftLPbound
                    (in_stack_fffffffffffffce0,in_stack_fffffffffffffcdc,
                     (double)in_stack_fffffffffffffcd0);
          goto LAB_002ee218;
        }
      }
      else {
        pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
        dVar15 = *pdVar6;
        pdVar6 = VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
        local_50 = dVar15 - *pdVar6;
        if ((local_38 < local_88) && (local_50 < (in_RDI->super_SPxRatioTester<double>).delta)) {
          local_88 = local_88 / 2.0;
          (*(in_RDI->super_SPxRatioTester<double>)._vptr_SPxRatioTester[3])();
          VectorBase<double>::operator[]((VectorBase<double> *)pSVar7,iVar2);
          SPxSolverBase<double>::shiftUPbound
                    ((SPxSolverBase<double> *)
                     CONCAT44(in_stack_fffffffffffffcf4,in_stack_fffffffffffffcf0),
                     (int)((ulong)in_stack_fffffffffffffce8 >> 0x20),
                     (double)in_stack_fffffffffffffce0);
          goto LAB_002ee218;
        }
      }
      local_50 = local_50 / local_38;
    } while (local_48 < local_50);
  }
LAB_002effe0:
  *local_18 = local_50;
  return (SPxId)local_8;
}

Assistant:

SPxId SPxHarrisRT<R>::selectEnter(R& val, int, bool)
{
   int i, j;
   SPxId enterId;
   R stab, x, y;
   R max = 0.0;
   R sel = 0.0;
   R lastshift;
   R cuseeps;
   R ruseeps;
   R cmaxabs = 1;
   R rmaxabs = 1;
   int pnr, cnr;

   R minStability = this->tolerances()->scaleAccordingToEpsilon(1e-4);
   R epsilon      = this->solver()->epsilon();
   R degeneps     = degenerateEps();

   VectorBase<R>& pvec = this->solver()->pVec();
   SSVectorBase<R>& pupd = this->solver()->pVec().delta();

   VectorBase<R>& cvec = this->solver()->coPvec();
   SSVectorBase<R>& cupd = this->solver()->coPvec().delta();

   const VectorBase<R>& upb = this->solver()->upBound();
   const VectorBase<R>& lpb = this->solver()->lpBound();
   const VectorBase<R>& ucb = this->solver()->ucBound();
   const VectorBase<R>& lcb = this->solver()->lcBound();

   assert(this->delta > epsilon);
   assert(epsilon > 0);
   assert(this->solver()->maxCycle() > 0);

   this->solver()->coPvec().delta().setup();
   this->solver()->pVec().delta().setup();

   if(val > epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);

         // phase 1:
         maxDelta(
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         maxDelta(
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(-infinity);
         ruseeps = rmaxabs * 0.001 * epsilon;

         if(ruseeps < epsilon)
            ruseeps = epsilon;

         cuseeps = cmaxabs * 0.001 * epsilon;

         if(cuseeps < epsilon)
            cuseeps = epsilon;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI01 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i] - degeneps);
               else
               {
                  y /= x;

                  if(y <= max && x >= stab)        // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i] + degeneps);
               else
               {
                  y /= x;

                  if(y <= max && -x >= stab)       // &&  y > sel-epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI02 removing value {}\n", cupd[i]);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(x < minStability && sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(-x < minStability && -sel < this->delta)
                     {
                        minStability /= 2.0;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel > max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }
   else if(val < -epsilon)
   {
      for(;;)
      {
         pnr = -1;
         cnr = -1;
         max = val;
         lastshift = this->solver()->shift();
         assert(this->delta > epsilon);


         // phase 1:
         minDelta
         (
            &rmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            pupd.size(),         /* # of indices in pupd */
            pupd.indexMem(),     /* nonzero indices in pupd */
            pupd.values(),       /* update VectorBase<R> for vec */
            pvec.get_const_ptr(),                /* current VectorBase<R> */
            lpb.get_const_ptr(),                 /* lower bounds for vec */
            upb.get_const_ptr()                  /* upper bounds for vec */
         );

         minDelta
         (
            &cmaxabs,            /* max abs value in upd */
            &max,                /* initial and chosen value */
            cupd.size(),         /* # of indices in cupd */
            cupd.indexMem(),     /* nonzero indices in cupd */
            cupd.values(),       /* update VectorBase<R> for vec */
            cvec.get_const_ptr(),                /* current VectorBase<R> */
            lcb.get_const_ptr(),                 /* lower bounds for vec */
            ucb.get_const_ptr()                  /* upper bounds for vec */
         );

         if(max == val)
            return enterId;


         // phase 2:
         stab = 0;
         sel = R(infinity);
         ruseeps = rmaxabs * epsilon * 0.001;
         cuseeps = cmaxabs * epsilon * 0.001;

         for(j = pupd.size() - 1; j >= 0; --j)
         {
            i = pupd.index(j);
            x = pupd[i];

            if(x > ruseeps)
            {
               y = lpb[i] - pvec[i];

               if(y > degeneps)
                  this->solver()->shiftLPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = x;
                  }
               }
            }
            else if(x < -ruseeps)
            {
               y = upb[i] - pvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUPbound(i, pvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->id(i);
                     sel = y;
                     pnr = i;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI03 removing value {}\n", pupd[i]);
               pupd.clearNum(j);
            }
         }

         for(j = cupd.size() - 1; j >= 0; --j)
         {
            i = cupd.index(j);
            x = cupd[i];

            if(x > cuseeps)
            {
               y = lcb[i] - cvec[i];

               if(y > degeneps)
                  this->solver()->shiftLCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && x > stab)         // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = x;
                  }
               }
            }
            else if(x < -cuseeps)
            {
               y = ucb[i] - cvec[i];

               if(y < -degeneps)
                  this->solver()->shiftUCbound(i, cvec[i]);  // ensure simplex improvement
               else
               {
                  y /= x;

                  if(y >= max && -x > stab)        // &&  y < sel+epsilon
                  {
                     enterId = this->solver()->coId(i);
                     sel = y;
                     cnr = j;
                     stab = -x;
                  }
               }
            }
            else
            {
               SPxOut::debug(this, "DHARRI04 removing value {}\n", x);
               cupd.clearNum(j);
            }
         }

         if(lastshift == this->solver()->shift())
         {
            if(cnr >= 0)
            {
               if(this->solver()->isBasic(enterId))
               {
                  cupd.clearNum(cnr);
                  continue;
               }
               else
                  break;
            }
            else if(pnr >= 0)
            {
               pvec[pnr] = this->solver()->vector(pnr) * cvec;

               if(this->solver()->isBasic(enterId))
               {
                  pupd.setValue(pnr, 0.0);
                  continue;
               }
               else
               {
                  x = pupd[pnr];

                  if(x > 0)
                  {
                     sel = lpb[pnr] - pvec[pnr];

                     if(x < minStability && -sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftLPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }
                  else
                  {
                     sel = upb[pnr] - pvec[pnr];

                     if(-x < minStability && sel < this->delta)
                     {
                        minStability /= 2;
                        this->solver()->shiftUPbound(pnr, pvec[pnr]);
                        continue;
                     }
                  }

                  sel /= x;
               }
            }
            else
            {
               val = 0;
               enterId.inValidate();
               return enterId;
            }

            if(sel < max)              // instability detected => recompute
               continue;               // ratio test with corrected value

            break;
         }
      }
   }

   assert(max * val >= 0);
   assert(enterId.type() != SPxId::INVALID);

   val = sel;

   return enterId;
}